

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaExist.c
# Opt level: O1

int Gia_ManQuantCheckOverlap(Gia_Man_t *p,int iObj)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong *puVar4;
  uint uVar5;
  
  uVar1 = p->nSuppWords;
  uVar3 = (ulong)uVar1;
  uVar5 = iObj * uVar1;
  if (-1 < (int)uVar5) {
    iVar2 = p->vSuppWords->nSize;
    if (((int)uVar5 < iVar2) && (0 < iVar2)) {
      if (0 < (int)uVar1) {
        puVar4 = p->vSuppWords->pArray;
        do {
          if ((puVar4[uVar5] & *puVar4) != 0) {
            return 1;
          }
          puVar4 = puVar4 + 1;
          uVar3 = uVar3 - 1;
        } while (uVar3 != 0);
      }
      return 0;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
}

Assistant:

int Gia_ManQuantCheckOverlap( Gia_Man_t * p, int iObj )
{
    return Abc_TtIntersect( Gia_ManQuantInfoId(p, iObj), Gia_ManQuantInfoId(p, 0), p->nSuppWords, 0 );
}